

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

Am_Object find_palette_for_command
                    (Am_Object *main_cmd,Am_Value *current_value,Am_Object *script_window)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object *in_RCX;
  Am_Am_Slot_Key slot;
  Am_Object undo_handler;
  Am_Object undo_db;
  Am_Value local_38;
  
  pAVar2 = Am_Object::Get((Am_Object *)current_value,0x19c,1);
  slot.value = 0;
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    Am_Am_Slot_Key::operator=(&slot,pAVar2);
  }
  else {
    slot.value = 0;
  }
  Am_Object::Get_Object(&undo_db,(Am_Slot_Key)in_RCX,(ulong)Am_UNDO_MENU_OF_COMMANDS);
  pAVar2 = Am_Object::Get(&undo_db,Am_UNDO_HANDLER_TO_DISPLAY,0);
  Am_Object::Am_Object(&undo_handler,pAVar2);
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"searching for palette for undo ");
    poVar3 = operator<<(poVar3,&undo_handler);
    poVar3 = std::operator<<(poVar3," from ");
    poVar3 = operator<<(poVar3,&undo_db);
    poVar3 = std::operator<<(poVar3," from ");
    poVar3 = operator<<(poVar3,in_RCX);
    poVar3 = std::operator<<(poVar3," slot ");
    poVar3 = operator<<(poVar3,&slot);
    poVar3 = std::operator<<(poVar3," value ");
    poVar3 = operator<<(poVar3,(Am_Value *)script_window);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  pAVar2 = (Am_Value *)(ulong)slot.value;
  Am_Value::Am_Value(&local_38,(Am_Value *)script_window);
  Am_Find_Palette_For(main_cmd,(Am_Am_Slot_Key)(Am_Slot_Key)&undo_handler,pAVar2);
  Am_Value::~Am_Value(&local_38);
  if (am_sdebug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"  found  ");
    poVar3 = operator<<(poVar3,main_cmd);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  Am_Object::~Am_Object(&undo_handler);
  Am_Object::~Am_Object(&undo_db);
  return (Am_Object)(Am_Object_Data *)main_cmd;
}

Assistant:

Am_Object
find_palette_for_command(Am_Object &main_cmd, Am_Value &current_value,
                         Am_Object &script_window)
{
  const Am_Value& slot_key_value = main_cmd.Peek(Am_SLOT_FOR_VALUE);
  Am_Am_Slot_Key slot;
  if (!slot_key_value.Valid())
    slot = 0;
  else
    slot = slot_key_value;
  Am_Object undo_db = script_window.Get_Object(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object undo_handler = undo_db.Get(Am_UNDO_HANDLER_TO_DISPLAY);
  if (am_sdebug)
    std::cout << "searching for palette for undo " << undo_handler << " from "
              << undo_db << " from " << script_window << " slot " << slot
              << " value " << current_value << std::endl
              << std::flush;
  Am_Object palette = Am_Find_Palette_For(undo_handler, slot, current_value);
  if (am_sdebug)
    std::cout << "  found  " << palette << std::endl << std::flush;
  return palette;
}